

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

bool leveldb::GetVarint64(Slice *input,uint64_t *value)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  
  pbVar1 = (byte *)(input->data_ + input->size_);
  if ((long)input->size_ < 1) {
    pbVar5 = (byte *)0x0;
  }
  else {
    pbVar5 = (byte *)0x0;
    uVar4 = 0;
    uVar7 = 0;
    pbVar3 = (byte *)input->data_;
    while( true ) {
      pbVar6 = pbVar3 + 1;
      bVar2 = *pbVar3;
      if (-1 < (char)bVar2) break;
      uVar7 = uVar7 | (ulong)(bVar2 & 0x7f) << ((byte)uVar4 & 0x3f);
      if ((0x38 < uVar4) || (uVar4 = uVar4 + 7, pbVar3 = pbVar6, pbVar1 <= pbVar6))
      goto LAB_00121758;
    }
    *value = uVar7 | (ulong)bVar2 << ((byte)uVar4 & 0x3f);
    pbVar5 = pbVar6;
  }
LAB_00121758:
  if (pbVar5 != (byte *)0x0) {
    input->data_ = (char *)pbVar5;
    input->size_ = (long)pbVar1 - (long)pbVar5;
  }
  return pbVar5 != (byte *)0x0;
}

Assistant:

void PutVarint32(std::string* dst, uint32_t v) {
  char buf[5];
  char* ptr = EncodeVarint32(buf, v);
  dst->append(buf, ptr - buf);
}